

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

void dxil_spv::propagate_precise
               (UnorderedSet<const_LLVMBC::Instruction_*> *cache,Instruction *value)

{
  uint uVar1;
  size_type sVar2;
  PHINode *this;
  Value *pVVar3;
  uint uVar4;
  Instruction *local_28;
  
  local_28 = value;
  sVar2 = std::
          _Hashtable<const_LLVMBC::Instruction_*,_const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Instruction_*>,_std::hash<const_LLVMBC::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&cache->_M_h,&local_28);
  if (sVar2 == 0) {
    std::__detail::
    _Insert_base<const_LLVMBC::Instruction_*,_const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Instruction_*>,_std::hash<const_LLVMBC::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<const_LLVMBC::Instruction_*,_const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Instruction_*>,_std::hash<const_LLVMBC::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)cache,&local_28);
    this = LLVMBC::dyn_cast<LLVMBC::PHINode>(&local_28->super_Value);
    if (this == (PHINode *)0x0) {
      uVar1 = LLVMBC::Instruction::getNumOperands(local_28);
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        pVVar3 = LLVMBC::Instruction::getOperand(local_28,uVar4);
        mark_precise(cache,pVVar3);
      }
    }
    else {
      uVar1 = LLVMBC::PHINode::getNumIncomingValues(this);
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        pVVar3 = LLVMBC::PHINode::getIncomingValue(this,uVar4);
        mark_precise(cache,pVVar3);
      }
    }
  }
  return;
}

Assistant:

static void propagate_precise(UnorderedSet<const llvm::Instruction *> &cache, const llvm::Instruction *value)
{
	if (cache.count(value) != 0)
		return;
	cache.insert(value);

	if (const auto *phi = llvm::dyn_cast<llvm::PHINode>(value))
	{
		for (unsigned i = 0, n = phi->getNumIncomingValues(); i < n; i++)
			mark_precise(cache, phi->getIncomingValue(i));
	}
	else
	{
		for (unsigned i = 0, n = value->getNumOperands(); i < n; i++)
			mark_precise(cache, value->getOperand(i));
	}
}